

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_list.c
# Opt level: O1

void check_list_add_end(List *lp,void *val)

{
  int iVar1;
  int iVar2;
  
  if (lp != (List *)0x0) {
    maybe_grow(lp);
    iVar1 = lp->last;
    iVar2 = iVar1 + 1;
    lp->last = iVar2;
    lp->n_elts = lp->n_elts + 1;
    lp->current = iVar2;
    lp->data[(long)iVar1 + 1] = val;
  }
  return;
}

Assistant:

void check_list_add_end(List * lp, void *val)
{
    if(lp == NULL)
        return;
    maybe_grow(lp);
    lp->last++;
    lp->n_elts++;
    lp->current = lp->last;
    lp->data[lp->current] = val;
}